

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O2

ParseResult __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
Parse<272u,rapidjson::BasicIStreamWrapper<std::istream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler)

{
  size_t sVar1;
  Ch *pCVar2;
  char *pcVar3;
  ParseResult PVar4;
  ulong uStack_20;
  
  *(undefined4 *)(this + 0x30) = 0;
  *(undefined8 *)(this + 0x38) = 0;
  SkipWhitespace<rapidjson::BasicIStreamWrapper<std::istream>>(is);
  uStack_20 = (ulong)*(uint *)(this + 0x30);
  if (*(uint *)(this + 0x30) != 0) goto LAB_0013b554;
  pcVar3 = is->current_;
  if (*pcVar3 == '\0') {
    uStack_20 = 1;
  }
  else {
    ParseValue<272u,rapidjson::BasicIStreamWrapper<std::istream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
              (this,is,handler);
    uStack_20 = (ulong)*(uint *)(this + 0x30);
    if (*(uint *)(this + 0x30) != 0) goto LAB_0013b554;
    SkipWhitespace<rapidjson::BasicIStreamWrapper<std::istream>>(is);
    uStack_20 = (ulong)*(uint *)(this + 0x30);
    if (*(uint *)(this + 0x30) != 0) goto LAB_0013b554;
    pcVar3 = is->current_;
    uStack_20 = 0;
    if (*pcVar3 == '\0') goto LAB_0013b554;
    uStack_20 = 2;
  }
  sVar1 = is->count_;
  pCVar2 = is->buffer_;
  *(int *)(this + 0x30) = (int)uStack_20;
  *(char **)(this + 0x38) = pcVar3 + (sVar1 - (long)pCVar2);
LAB_0013b554:
  *(undefined8 *)(this + 0x18) = *(undefined8 *)(this + 0x10);
  PVar4.offset_ = *(size_t *)(this + 0x38);
  PVar4._0_8_ = uStack_20;
  return PVar4;
}

Assistant:

ParseResult Parse(InputStream& is, Handler& handler) {
        if (parseFlags & kParseIterativeFlag)
            return IterativeParse<parseFlags>(is, handler);

        parseResult_.Clear();

        ClearStackOnExit scope(*this);

        SkipWhitespaceAndComments<parseFlags>(is);
        CEREAL_RAPIDJSON_PARSE_ERROR_EARLY_RETURN(parseResult_);

        if (CEREAL_RAPIDJSON_UNLIKELY(is.Peek() == '\0')) {
            CEREAL_RAPIDJSON_PARSE_ERROR_NORETURN(kParseErrorDocumentEmpty, is.Tell());
            CEREAL_RAPIDJSON_PARSE_ERROR_EARLY_RETURN(parseResult_);
        }
        else {
            ParseValue<parseFlags>(is, handler);
            CEREAL_RAPIDJSON_PARSE_ERROR_EARLY_RETURN(parseResult_);

            if (!(parseFlags & kParseStopWhenDoneFlag)) {
                SkipWhitespaceAndComments<parseFlags>(is);
                CEREAL_RAPIDJSON_PARSE_ERROR_EARLY_RETURN(parseResult_);

                if (CEREAL_RAPIDJSON_UNLIKELY(is.Peek() != '\0')) {
                    CEREAL_RAPIDJSON_PARSE_ERROR_NORETURN(kParseErrorDocumentRootNotSingular, is.Tell());
                    CEREAL_RAPIDJSON_PARSE_ERROR_EARLY_RETURN(parseResult_);
                }
            }
        }

        return parseResult_;
    }